

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QMetaCallEvent::placeMetaCall(QMetaCallEvent *this,QObject *object)

{
  ushort uVar1;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var2;
  int iVar3;
  undefined4 extraout_var;
  
  _Var2._M_head_impl =
       (this->d).slotObj_._M_t.
       super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
       super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
       super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (QSlotObjectBase *)0x0) {
    (*(_Var2._M_head_impl)->m_impl)(1,_Var2._M_head_impl,object,(this->d).args_,(bool *)0x0);
    return;
  }
  if ((this->d).callFunction_ != (StaticMetaCallFunction)0x0) {
    uVar1 = (this->d).method_offset_;
    iVar3 = (**object->_vptr_QObject)(object);
    iVar3 = QMetaObject::methodOffset((QMetaObject *)CONCAT44(extraout_var,iVar3));
    if ((int)(uint)uVar1 <= iVar3) {
      (*(this->d).callFunction_)
                (object,InvokeMetaMethod,(uint)(this->d).method_relative_,(this->d).args_);
      return;
    }
  }
  QMetaObject::metacall
            (object,InvokeMetaMethod,
             (uint)(this->d).method_relative_ + (uint)(this->d).method_offset_,(this->d).args_);
  return;
}

Assistant:

void QMetaCallEvent::placeMetaCall(QObject *object)
{
    if (d.slotObj_) {
        d.slotObj_->call(object, d.args_);
    } else if (d.callFunction_ && d.method_offset_ <= object->metaObject()->methodOffset()) {
        d.callFunction_(object, QMetaObject::InvokeMetaMethod, d.method_relative_, d.args_);
    } else {
        QMetaObject::metacall(object, QMetaObject::InvokeMetaMethod,
                              d.method_offset_ + d.method_relative_, d.args_);
    }
}